

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O3

Abc_Obj_t *
Abc_ExactBuildNode(word *pTruth,int nVars,int *pArrTimeProfile,Abc_Obj_t **pFanins,Abc_Ntk_t *pNtk)

{
  ulong uVar1;
  char cVar2;
  Abc_Ntk_t *pNtk_00;
  int iVar3;
  void *pvVar4;
  Abc_Obj_t *pAVar5;
  char *pcVar6;
  char *pcVar7;
  uint *puVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  char *pcVar14;
  ulong uVar15;
  byte *pbVar16;
  char pGateTruth [5];
  char *pSol;
  timespec ts_3;
  int pNormalArrTime [8];
  int nMaxArrival;
  byte local_c8;
  byte bStack_c7;
  byte bStack_c6;
  char cStack_c5;
  undefined1 uStack_c4;
  uint *local_c0;
  Abc_Ntk_t *local_b8;
  ulong local_b0;
  ulong local_a8;
  char *local_a0;
  ulong local_98;
  ulong local_90;
  timespec local_88;
  timespec local_78 [2];
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  int local_34;
  
  local_a0 = (char *)0x0;
  local_b8 = pNtk;
  iVar3 = clock_gettime(3,local_78);
  if (iVar3 < 0) {
    lVar10 = 1;
  }
  else {
    lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_78[0].tv_nsec),8);
    lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_78[0].tv_sec * -1000000;
  }
  if (nVars == 0) {
    iVar3 = clock_gettime(3,local_78);
    if (iVar3 < 0) {
      lVar11 = -1;
    }
    else {
      lVar11 = local_78[0].tv_nsec / 1000 + local_78[0].tv_sec * 1000000;
    }
    s_pSesStore->timeTotal = s_pSesStore->timeTotal + lVar11 + lVar10;
    if ((*pTruth & 1) == 0) {
      pAVar5 = Abc_NtkCreateNodeConst0(local_b8);
    }
    else {
      pAVar5 = Abc_NtkCreateNodeConst1(local_b8);
    }
  }
  else if (nVars == 1) {
    iVar3 = clock_gettime(3,local_78);
    if (iVar3 < 0) {
      lVar11 = -1;
    }
    else {
      lVar11 = local_78[0].tv_nsec / 1000 + local_78[0].tv_sec * 1000000;
    }
    s_pSesStore->timeTotal = s_pSesStore->timeTotal + lVar11 + lVar10;
    if ((*pTruth & 1) == 0) {
      pAVar5 = Abc_NtkCreateNodeBuf(local_b8,*pFanins);
    }
    else {
      pAVar5 = Abc_NtkCreateNodeInv(local_b8,*pFanins);
    }
  }
  else {
    if (0 < nVars) {
      memcpy(local_78,pArrTimeProfile,(ulong)(uint)nVars * 4);
    }
    Abc_NormalizeArrivalTimes((int *)local_78,nVars,&local_34);
    iVar3 = Ses_StoreGetEntry(s_pSesStore,pTruth,nVars,(int *)local_78,&local_a0);
    pcVar14 = local_a0;
    if (iVar3 == 0) {
      __assert_fail("Ses_StoreGetEntry( s_pSesStore, pTruth, nVars, pNormalArrTime, &pSol )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                    ,0xb68,
                    "Abc_Obj_t *Abc_ExactBuildNode(word *, int, int *, Abc_Obj_t **, Abc_Ntk_t *)");
    }
    if (local_a0 == (char *)0x0) {
      iVar3 = clock_gettime(3,&local_88);
      if (iVar3 < 0) {
        lVar11 = -1;
      }
      else {
        lVar11 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
      }
      s_pSesStore->timeTotal = s_pSesStore->timeTotal + lVar11 + lVar10;
      pAVar5 = (Abc_Obj_t *)0x0;
    }
    else {
      if (*local_a0 != nVars) {
        __assert_fail("pSol[ABC_EXACT_SOL_NVARS] == nVars",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                      ,0xb6f,
                      "Abc_Obj_t *Abc_ExactBuildNode(word *, int, int *, Abc_Obj_t **, Abc_Ntk_t *)"
                     );
      }
      local_58 = lVar10;
      if (local_a0[1] != '\x01') {
        __assert_fail("pSol[ABC_EXACT_SOL_NFUNC] == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                      ,0xb70,
                      "Abc_Obj_t *Abc_ExactBuildNode(word *, int, int *, Abc_Obj_t **, Abc_Ntk_t *)"
                     );
      }
      cVar2 = local_a0[2];
      local_c0 = (uint *)malloc(0x10);
      uVar15 = 8;
      if (6 < (cVar2 + nVars) - 1U) {
        uVar15 = (ulong)(uint)(nVars + cVar2);
      }
      local_c0[1] = 0;
      uVar13 = (uint)uVar15;
      *local_c0 = uVar13;
      local_b0 = 0;
      local_98 = (ulong)(uint)nVars;
      if (uVar13 == 0) {
        pvVar4 = (void *)0x0;
      }
      else {
        pvVar4 = malloc((long)(int)uVar13 << 3);
      }
      *(void **)(local_c0 + 2) = pvVar4;
      cStack_c5 = '0';
      uStack_c4 = 0;
      iVar3 = (int)local_98;
      if (0 < iVar3) {
        puVar8 = local_c0;
        uVar12 = 0;
        do {
          pAVar5 = pFanins[uVar12];
          if (pAVar5 == (Abc_Obj_t *)0x0) {
            __assert_fail("pFanins[i]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                          ,0xb79,
                          "Abc_Obj_t *Abc_ExactBuildNode(word *, int, int *, Abc_Obj_t **, Abc_Ntk_t *)"
                         );
          }
          iVar3 = (int)uVar15;
          if ((int)uVar12 == iVar3) {
            if (iVar3 < 0x10) {
              if (*(void **)(puVar8 + 2) == (void *)0x0) {
                pvVar4 = malloc(0x80);
              }
              else {
                pvVar4 = realloc(*(void **)(puVar8 + 2),0x80);
              }
              *(void **)(local_c0 + 2) = pvVar4;
              *local_c0 = 0x10;
              uVar15 = 0x10;
              puVar8 = local_c0;
            }
            else {
              uVar15 = (ulong)(uint)(iVar3 * 2);
              if (*(void **)(puVar8 + 2) == (void *)0x0) {
                pvVar4 = malloc(uVar15 * 8);
              }
              else {
                pvVar4 = realloc(*(void **)(puVar8 + 2),uVar15 * 8);
              }
              *(void **)(local_c0 + 2) = pvVar4;
              *local_c0 = iVar3 * 2;
              puVar8 = local_c0;
            }
          }
          else {
            pvVar4 = *(void **)(puVar8 + 2);
          }
          uVar1 = uVar12 + 1;
          puVar8[1] = (uint)uVar1;
          *(Abc_Obj_t **)((long)pvVar4 + uVar12 * 8) = pAVar5;
          uVar12 = uVar1;
        } while ((uint)nVars != uVar1);
        iVar3 = (int)local_98;
        pcVar14 = local_a0;
        local_b0 = uVar1;
      }
      pbVar16 = (byte *)(pcVar14 + 3);
      if (pcVar14[2] < '\x01') {
        iVar9 = (int)local_b0;
      }
      else {
        local_90 = local_b0 & 0xffffffff;
        local_50 = local_90 * 8;
        lVar10 = 0;
        lVar11 = 0;
        pcVar6 = pcVar14;
        local_a8 = uVar15;
        do {
          pNtk_00 = local_b8;
          bStack_c6 = pbVar16[lVar11 * 4] & 1 | 0x30;
          bStack_c7 = pbVar16[lVar11 * 4] >> 1 & 1 | 0x30;
          local_c8 = pbVar16[lVar11 * 4] >> 2 & 1 | 0x30;
          if (pcVar14[lVar11 * 4 + 4] != '\x02') {
            __assert_fail("*p == 2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                          ,0xb86,
                          "Abc_Obj_t *Abc_ExactBuildNode(word *, int, int *, Abc_Obj_t **, Abc_Ntk_t *)"
                         );
          }
          if ((int)lVar11 + 1 == (int)pcVar6[2]) {
            if (pcVar14[lVar11 * 4 + 7] < '\0') {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x130,"int Abc_LitIsCompl(int)");
            }
            if ((pcVar14[lVar11 * 4 + 7] & 1U) != 0) {
              uVar13 = CONCAT13(cStack_c5,
                                CONCAT12(pbVar16[lVar11 * 4],
                                         CONCAT11(pbVar16[lVar11 * 4] >> 1,pbVar16[lVar11 * 4] >> 2)
                                        )) & 0xff010101;
              local_c8 = ((byte)((byte)uVar13 | 0x30) == 0x30) + 0x30;
              bStack_c7 = ((byte)((byte)(uVar13 >> 8) | 0x30) == 0x30) + 0x30;
              bStack_c6 = ((byte)((byte)(uVar13 >> 0x10) | 0x30) == 0x30) + 0x30;
              cStack_c5 = ((char)(uVar13 >> 0x18) == '0') + '0';
            }
          }
          local_48 = lVar10;
          pcVar6 = Abc_SopFromTruthBin((char *)&local_c8);
          pAVar5 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_NODE);
          if (pAVar5 == (Abc_Obj_t *)0x0) {
            __assert_fail("pObj",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                          ,0xb90,
                          "Abc_Obj_t *Abc_ExactBuildNode(word *, int, int *, Abc_Obj_t **, Abc_Ntk_t *)"
                         );
          }
          lVar10 = local_90 + lVar11;
          pcVar7 = Abc_SopRegister((Mem_Flex_t *)pNtk_00->pManFunc,pcVar6);
          (pAVar5->field_5).pData = pcVar7;
          iVar3 = (int)local_a8;
          local_40 = lVar10;
          if ((int)lVar10 == iVar3) {
            if (iVar3 < 0x10) {
              if (*(void **)(local_c0 + 2) == (void *)0x0) {
                pvVar4 = malloc(0x80);
              }
              else {
                pvVar4 = realloc(*(void **)(local_c0 + 2),0x80);
              }
              *(void **)(local_c0 + 2) = pvVar4;
              *local_c0 = 0x10;
              local_a8 = 0x10;
            }
            else {
              local_a8 = (ulong)(uint)(iVar3 * 2);
              if (*(void **)(local_c0 + 2) == (void *)0x0) {
                pvVar4 = malloc(local_a8 * 8);
              }
              else {
                pvVar4 = realloc(*(void **)(local_c0 + 2),local_a8 * 8);
              }
              *(void **)(local_c0 + 2) = pvVar4;
              *local_c0 = (uint)local_a8;
            }
          }
          else {
            pvVar4 = *(void **)(local_c0 + 2);
          }
          uVar13 = (int)local_90 + (int)lVar11 + 1;
          local_c0[1] = uVar13;
          *(Abc_Obj_t **)((long)pvVar4 + lVar11 * 8 + local_50) = pAVar5;
          if (pcVar6 != (char *)0x0) {
            free(pcVar6);
          }
          cVar2 = pcVar14[lVar11 * 4 + 5];
          if ((cVar2 < '\0') || ((int)local_40 < cVar2)) goto LAB_002c0910;
          lVar10 = *(long *)(local_c0 + 2);
          Abc_ObjAddFanin(pAVar5,*(Abc_Obj_t **)(lVar10 + (ulong)(uint)(int)cVar2 * 8));
          cVar2 = pcVar14[lVar11 * 4 + 6];
          if ((cVar2 < '\0') || (uVar13 <= (uint)(int)cVar2)) goto LAB_002c0910;
          Abc_ObjAddFanin(pAVar5,*(Abc_Obj_t **)(lVar10 + (ulong)(uint)(int)cVar2 * 8));
          lVar11 = lVar11 + 1;
          lVar10 = local_48 + -4;
          pcVar6 = local_a0;
        } while ((int)lVar11 < (int)local_a0[2]);
        iVar9 = (int)local_b0 + (int)lVar11;
        pbVar16 = pbVar16 + -lVar10;
        iVar3 = (int)local_98;
      }
      lVar10 = local_58;
      puVar8 = local_c0;
      if ((char)*pbVar16 < '\0') {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      uVar13 = (uint)(*pbVar16 >> 1) + iVar3;
      if (((int)uVar13 < 0) || (iVar9 <= (int)uVar13)) {
LAB_002c0910:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pAVar5 = *(Abc_Obj_t **)((long)*(void **)(local_c0 + 2) + (ulong)uVar13 * 8);
      free(*(void **)(local_c0 + 2));
      free(puVar8);
      iVar3 = clock_gettime(3,&local_88);
      if (iVar3 < 0) {
        lVar11 = -1;
      }
      else {
        lVar11 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
      }
      s_pSesStore->timeTotal = s_pSesStore->timeTotal + lVar11 + lVar10;
    }
  }
  return pAVar5;
}

Assistant:

Abc_Obj_t * Abc_ExactBuildNode( word * pTruth, int nVars, int * pArrTimeProfile, Abc_Obj_t ** pFanins, Abc_Ntk_t * pNtk )
{
    char * pSol = NULL;
    int i, j, nMaxArrival;
    int pNormalArrTime[8];
    char const * p;
    Abc_Obj_t * pObj;
    Vec_Ptr_t * pGates;
    char pGateTruth[5];
    char * pSopCover;
    abctime timeStart = Abc_Clock();

    if ( nVars == 0 )
    {
        s_pSesStore->timeTotal += ( Abc_Clock() - timeStart );
        return (pTruth[0] & 1) ? Abc_NtkCreateNodeConst1(pNtk) : Abc_NtkCreateNodeConst0(pNtk);
    }
    if ( nVars == 1 )
    {
        s_pSesStore->timeTotal += ( Abc_Clock() - timeStart );
        return (pTruth[0] & 1) ? Abc_NtkCreateNodeInv(pNtk, pFanins[0]) : Abc_NtkCreateNodeBuf(pNtk, pFanins[0]);
    }

    for ( i = 0; i < nVars; ++i )
        pNormalArrTime[i] = pArrTimeProfile[i];
    Abc_NormalizeArrivalTimes( pNormalArrTime, nVars, &nMaxArrival );
    assert( Ses_StoreGetEntry( s_pSesStore, pTruth, nVars, pNormalArrTime, &pSol ) );
    if ( !pSol )
    {
        s_pSesStore->timeTotal += ( Abc_Clock() - timeStart );
        return NULL;
    }

    assert( pSol[ABC_EXACT_SOL_NVARS] == nVars );
    assert( pSol[ABC_EXACT_SOL_NFUNC] == 1 );

    pGates = Vec_PtrAlloc( nVars + pSol[ABC_EXACT_SOL_NGATES] );
    pGateTruth[3] = '0';
    pGateTruth[4] = '\0';

    /* primary inputs */
    for ( i = 0; i < nVars; ++i )
    {
        assert( pFanins[i] );
        Vec_PtrPush( pGates, pFanins[i] );
    }

    /* gates */
    p = pSol + 3;
    for ( i = 0; i < pSol[ABC_EXACT_SOL_NGATES]; ++i )
    {
        pGateTruth[2] = '0' + ( *p & 1 );
        pGateTruth[1] = '0' + ( ( *p >> 1 ) & 1 );
        pGateTruth[0] = '0' + ( ( *p >> 2 ) & 1 );
        ++p;

        assert( *p == 2 ); /* binary gate */
        ++p;

        /* invert truth table if we are last gate and inverted */
        if ( i + 1 == pSol[ABC_EXACT_SOL_NGATES] && Abc_LitIsCompl( *( p + 2 ) ) )
            for ( j = 0; j < 4; ++j )
                pGateTruth[j] = ( pGateTruth[j] == '0' ) ? '1' : '0';

        pSopCover = Abc_SopFromTruthBin( pGateTruth );
        pObj = Abc_NtkCreateNode( pNtk );
        assert( pObj );
        pObj->pData = Abc_SopRegister( (Mem_Flex_t*)pNtk->pManFunc, pSopCover );
        Vec_PtrPush( pGates, pObj );
        ABC_FREE( pSopCover );

        Abc_ObjAddFanin( pObj, (Abc_Obj_t *)Vec_PtrEntry( pGates, *p++ ) );
        Abc_ObjAddFanin( pObj, (Abc_Obj_t *)Vec_PtrEntry( pGates, *p++ ) );
    }

    /* output */
    pObj = (Abc_Obj_t *)Vec_PtrEntry( pGates, nVars + Abc_Lit2Var( *p ) );

    Vec_PtrFree( pGates );

    s_pSesStore->timeTotal += ( Abc_Clock() - timeStart );
    return pObj;
}